

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

void ccall_struct_ret(CCallState *cc,int *rcl,uint8_t *dp,CTSize sz)

{
  uint local_44;
  uint local_40;
  uint32_t i;
  MSize nfpr;
  MSize ngpr;
  GPRArg sp [2];
  CTSize sz_local;
  uint8_t *dp_local;
  int *rcl_local;
  CCallState *cc_local;
  
  i = 0;
  local_40 = 0;
  for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
    if ((rcl[local_44] & 1U) == 0) {
      if ((rcl[local_44] & 2U) != 0) {
        *(double *)(&nfpr + (ulong)local_44 * 2) = cc->fpr[local_40].d[0];
        local_40 = local_40 + 1;
      }
    }
    else {
      *(GPRArg *)(&nfpr + (ulong)local_44 * 2) = cc->gpr[i];
      i = i + 1;
    }
  }
  sp[1]._4_4_ = sz;
  memcpy(dp,&nfpr,(ulong)sz);
  return;
}

Assistant:

static void ccall_struct_ret(CCallState *cc, int *rcl, uint8_t *dp, CTSize sz)
{
  GPRArg sp[2];
  MSize ngpr = 0, nfpr = 0;
  uint32_t i;
  for (i = 0; i < 2; i++) {
    if ((rcl[i] & CCALL_RCL_INT)) {  /* Integer class takes precedence. */
      sp[i] = cc->gpr[ngpr++];
    } else if ((rcl[i] & CCALL_RCL_SSE)) {
      sp[i] = cc->fpr[nfpr++].l[0];
    }
  }
  memcpy(dp, sp, sz);
}